

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O2

bool __thiscall Glucose::SimpSolver::substitute(SimpSolver *this,Var v,Lit x)

{
  vec<Glucose::Lit> *this_00;
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  bool bVar4;
  int iVar5;
  vec<unsigned_int> *pvVar6;
  int j;
  long lVar7;
  Var local_48;
  Lit local_44;
  vec<unsigned_int> *local_40;
  long local_38;
  
  if ((this->super_Solver).ok == true) {
    (this->eliminated).data[v] = '\x01';
    local_48 = v;
    Solver::setDecisionVar(&this->super_Solver,v,false);
    pvVar6 = OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted>::lookup
                       (&this->occurs,&local_48);
    this_00 = &(this->super_Solver).add_tmp;
    local_38 = 0;
    local_40 = pvVar6;
    while (local_38 < pvVar6->sz) {
      uVar1 = pvVar6->data[local_38];
      if ((this->super_Solver).add_tmp.data != (Lit *)0x0) {
        (this->super_Solver).add_tmp.sz = 0;
      }
      puVar3 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
      for (lVar7 = 0; lVar7 < (int)puVar3[(ulong)uVar1 + 1]; lVar7 = lVar7 + 1) {
        uVar2 = puVar3[(ulong)uVar1 + lVar7 + 3];
        local_44.x = uVar2 & 1 ^ x.x;
        if ((int)uVar2 >> 1 != local_48) {
          local_44.x = uVar2;
        }
        vec<Glucose::Lit>::push(this_00,&local_44);
      }
      iVar5 = (*(this->super_Solver).super_Clone._vptr_Clone[4])(this,this_00);
      lVar7 = local_38;
      pvVar6 = local_40;
      if ((char)iVar5 == '\0') {
        (this->super_Solver).ok = false;
        goto LAB_00116728;
      }
      removeClause(this,local_40->data[local_38],false);
      local_38 = lVar7 + 1;
    }
    bVar4 = true;
  }
  else {
LAB_00116728:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool SimpSolver::substitute(Var v, Lit x)
{
    assert(!frozen[v]);
    assert(!isEliminated(v));
    assert(value(v) == l_Undef);

    if (!ok) return false;

    eliminated[v] = true;
    setDecisionVar(v, false);
    const vec<CRef>& cls = occurs.lookup(v);
    
    vec<Lit>& subst_clause = add_tmp;
    for (int i = 0; i < cls.size(); i++){
        Clause& c = ca[cls[i]];

        subst_clause.clear();
        for (int j = 0; j < c.size(); j++){
            Lit p = c[j];
            subst_clause.push(var(p) == v ? x ^ sign(p) : p);
        }

 
        if (!addClause_(subst_clause))
            return ok = false;

       removeClause(cls[i]);
 
   }

    return true;
}